

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfSampleCountChannel.cpp
# Opt level: O3

void __thiscall Imf_3_4::SampleCountChannel::set(SampleCountChannel *this,int r,uint *newNumSamples)

{
  int iVar1;
  long lVar2;
  
  if (0 < (this->super_ImageChannel)._pixelsPerRow) {
    iVar1 = (((this->super_ImageChannel)._level)->_dataWindow).min.x;
    lVar2 = 0;
    do {
      set(this,iVar1 + (int)lVar2,r + iVar1,newNumSamples[lVar2]);
      lVar2 = lVar2 + 1;
    } while (lVar2 < (this->super_ImageChannel)._pixelsPerRow);
  }
  return;
}

Assistant:

void
SampleCountChannel::set (int r, unsigned int newNumSamples[])
{
    int x = level ().dataWindow ().min.x;
    int y = r + level ().dataWindow ().min.x;

    for (int i = 0; i < pixelsPerRow (); ++i, ++x)
        set (x, y, newNumSamples[i]);
}